

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O0

void dSetRWork(int m,int panel_size,double *dworkptr,double **dense,double **tempv)

{
  int iVar1;
  int iVar2;
  int local_4c;
  int local_40;
  int rowblk;
  int maxsuper;
  double zero;
  double **tempv_local;
  double **dense_local;
  double *dworkptr_local;
  int panel_size_local;
  int m_local;
  
  iVar1 = sp_ienv(3);
  iVar2 = sp_ienv(7);
  if (iVar2 < iVar1) {
    local_40 = sp_ienv(3);
  }
  else {
    local_40 = sp_ienv(7);
  }
  iVar1 = sp_ienv(4);
  *dense = dworkptr;
  *tempv = *dense + panel_size * m;
  dfill(*dense,m * panel_size,0.0);
  local_4c = m;
  if (m <= (local_40 + iVar1) * panel_size) {
    local_4c = (local_40 + iVar1) * panel_size;
  }
  dfill(*tempv,local_4c,0.0);
  return;
}

Assistant:

void
dSetRWork(int m, int panel_size, double *dworkptr,
	 double **dense, double **tempv)
{
    double zero = 0.0;

    int maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
        rowblk   = sp_ienv(4);
    *dense = dworkptr;
    *tempv = *dense + panel_size*m;
    dfill (*dense, m * panel_size, zero);
    dfill (*tempv, NUM_TEMPV(m,panel_size,maxsuper,rowblk), zero);     
}